

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O0

void visitor_suite::test_void(void)

{
  allocator_type local_19;
  undefined1 local_18 [8];
  storage_type data;
  
  std::allocator<char>::allocator();
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  small_union<bool>((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_18,
                    true,&local_19);
  std::allocator<char>::~allocator(&local_19);
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::visitor_void,void>
            ((small_union<std::allocator<char>,int,unsigned_long,bool,int> *)local_18);
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::const_visitor_void,void>
            ((small_union<std::allocator<char>,int,unsigned_long,bool,int> *)local_18);
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  ~small_union((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_18);
  return;
}

Assistant:

void test_void()
{
    storage_type data{true};
    data.call<visitor_void, void>();
    data.call<const_visitor_void, void>();
}